

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

void __thiscall
TPZSparseBlockDiagonal<float>::UpdateFrom
          (TPZSparseBlockDiagonal<float> *this,TPZAutoPointer<TPZMatrix<float>_> *mat)

{
  bool bVar1;
  ostream *poVar2;
  float *buf;
  long *sz;
  long *plVar3;
  TPZMatrix<float> *pTVar4;
  TPZAutoPointer *in_RSI;
  TPZFMatrix<float> *in_RDI;
  TPZFMatrix<float> block;
  int64_t r;
  TPZManVector<long,_1000> indices;
  int64_t pos;
  int64_t bsize;
  int64_t b;
  int64_t nblock;
  TPZManVector<long,_1000> *in_stack_ffffffffffffdf60;
  int64_t in_stack_ffffffffffffdf78;
  long lVar5;
  TPZManVector<long,_1000> *in_stack_ffffffffffffdf80;
  long *in_stack_ffffffffffffdf88;
  TPZManVector<long,_1000> *in_stack_ffffffffffffdf90;
  TPZAutoPointer *this_00;
  undefined1 local_2038 [144];
  long local_1fa8;
  TPZVec<long> local_1f90 [251];
  int64_t local_30;
  TPZManVector<long,_1000> *local_28;
  int64_t local_20;
  int64_t local_18;
  
  this_00 = in_RSI;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    (in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
    local_18 = TPZVec<int>::NElements((TPZVec<int> *)((in_RDI->fPivot).fExtAlloc + 2));
    TPZManVector<long,_1000>::TPZManVector(in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf78);
    for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
      buf = (float *)TPZVec<int>::operator[]
                               ((TPZVec<int> *)((in_RDI->fPivot).fExtAlloc + 2),local_20);
      local_28 = (TPZManVector<long,_1000> *)(long)(int)*buf;
      TPZManVector<long,_1000>::Resize(in_stack_ffffffffffffdf90,(int64_t)in_stack_ffffffffffffdf88)
      ;
      sz = TPZVec<long>::operator[]
                     ((TPZVec<long> *)&(in_RDI->fPivot).super_TPZVec<int>.fStore,local_20);
      local_30 = *sz;
      for (local_1fa8 = 0; local_1fa8 < (long)local_28; local_1fa8 = local_1fa8 + 1) {
        in_stack_ffffffffffffdf90 = (TPZManVector<long,_1000> *)&(in_RDI->fWork).fNElements;
        plVar3 = TPZVec<long>::operator[]
                           ((TPZVec<long> *)
                            &in_RDI[1].super_TPZMatrix<float>.super_TPZBaseMatrix.fCol,local_20);
        in_stack_ffffffffffffdf88 =
             TPZVec<long>::operator[]
                       (&in_stack_ffffffffffffdf90->super_TPZVec<long>,*plVar3 + local_1fa8);
        lVar5 = *in_stack_ffffffffffffdf88;
        plVar3 = TPZVec<long>::operator[](local_1f90,local_1fa8);
        *plVar3 = lVar5;
      }
      in_stack_ffffffffffffdf60 = local_28;
      TPZVec<float>::operator[]((TPZVec<float> *)&in_RDI->fElem,local_30);
      TPZFMatrix<float>::TPZFMatrix(in_RDI,(int64_t)this_00,(int64_t)in_RSI,buf,(int64_t)sz);
      pTVar4 = TPZAutoPointer<TPZMatrix<float>_>::operator->
                         ((TPZAutoPointer<TPZMatrix<float>_> *)this_00);
      (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x49])
                (pTVar4,local_1f90,local_2038);
      TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x13a78bd);
    }
    TPZManVector<long,_1000>::~TPZManVector(in_stack_ffffffffffffdf60);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "virtual void TPZSparseBlockDiagonal<float>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar>>) [TVar = float]"
                            );
    std::operator<<(poVar2," called with zero argument\n");
  }
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar> > mat)
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZSparseBlockDiagonal::UpdateFrom");
#endif
	if(!mat) 
	{
		cout << __PRETTY_FUNCTION__ << " called with zero argument\n";
		return;
	}
	this->fDecomposed = ENoDecompose;
	int64_t nblock = this->fBlockSize.NElements();
	int64_t b,bsize,pos;
	TPZManVector<int64_t,1000> indices;
	for(b=0; b<nblock; b++) {
		bsize = this->fBlockSize[b];
		indices.Resize(bsize);
		int64_t r;
		pos = this->fBlockPos[b];
		for(r=0; r<bsize; r++) indices[r] = fBlock[fBlockIndex[b]+r]; 
		TPZFMatrix<TVar> block(bsize,bsize,&this->fStorage[pos],bsize*bsize);
		mat->GetSub(indices,block);
	}
	
}